

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O0

uint64_t FinalHuffmanCost(VP8LStreaks *stats)

{
  uint64_t uVar1;
  int *in_RDI;
  uint32_t retval_extra;
  uint64_t retval;
  
  uVar1 = InitialHuffmanCost();
  return uVar1 + (ulong)(uint)(in_RDI[4] * 0xd20 +
                              in_RDI[2] * 0x730 +
                              in_RDI[1] * 0xa50 + in_RDI[5] * 0x2d0 +
                              *in_RDI * 0x640 + in_RDI[3] * 0xf0) * 0x2000;
}

Assistant:

static uint64_t FinalHuffmanCost(const VP8LStreaks* const stats) {
  // The constants in this function are empirical and got rounded from
  // their original values in 1/8 when switched to 1/1024.
  uint64_t retval = InitialHuffmanCost();
  // Second coefficient: Many zeros in the histogram are covered efficiently
  // by a run-length encode. Originally 2/8.
  uint32_t retval_extra = stats->counts[0] * 1600 + 240 * stats->streaks[0][1];
  // Second coefficient: Constant values are encoded less efficiently, but still
  // RLE'ed. Originally 6/8.
  retval_extra += stats->counts[1] * 2640 + 720 * stats->streaks[1][1];
  // 0s are usually encoded more efficiently than non-0s.
  // Originally 15/8.
  retval_extra += 1840 * stats->streaks[0][0];
  // Originally 26/8.
  retval_extra += 3360 * stats->streaks[1][0];
  return retval + ((uint64_t)retval_extra << (LOG_2_PRECISION_BITS - 10));
}